

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

bool __thiscall
QXmlStreamWriterPrivate::finishStartElement(QXmlStreamWriterPrivate *this,bool contents)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  size_t in_RCX;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  Tag tag;
  Tag local_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ushort *)&this->field_0x78;
  *(ushort *)&this->field_0x78 =
       uVar1 & 0xffef | (ushort)((int)CONCAT71(in_register_00000031,contents) << 4);
  if ((uVar1 & 2) != 0) {
    if ((uVar1 & 4) == 0) {
      pvVar3 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x519d0b);
      write(this,0x519d0b,pvVar3,in_RCX);
      uVar2 = *(ushort *)&this->field_0x78;
    }
    else {
      pvVar3 = (void *)QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])"/>");
      write(this,0x519ba4,pvVar3,in_RCX);
      local_88.tagStackStringStorageSize = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.namespaceDeclarationsSize = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.namespaceDeclaration.namespaceUri.m_pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.namespaceDeclaration.namespaceUri.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.namespaceDeclaration.prefix.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.namespaceDeclaration.namespaceUri.m_string = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.namespaceDeclaration.prefix.m_string = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.namespaceDeclaration.prefix.m_pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.qualifiedName.m_pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.qualifiedName.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.name.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.qualifiedName.m_string = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.name.m_string = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.name.m_pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QXmlStreamPrivateTagStack::tagStack_pop(&local_88,&this->super_QXmlStreamPrivateTagStack);
      uVar2 = *(ushort *)&this->field_0x78 & 0xfff7;
    }
    this->lastNamespaceDeclaration =
         (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
    *(ushort *)&this->field_0x78 = uVar2 & 0xfdf9 | 0x200;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return SUB41((uVar1 & 0x10) >> 4,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QXmlStreamWriterPrivate::finishStartElement(bool contents)
{
    bool hadSomethingWritten = wroteSomething;
    wroteSomething = contents;
    if (!inStartElement)
        return hadSomethingWritten;

    if (inEmptyElement) {
        write("/>");
        QXmlStreamWriterPrivate::Tag tag = tagStack_pop();
        lastNamespaceDeclaration = tag.namespaceDeclarationsSize;
        lastWasStartElement = false;
    } else {
        write(">");
    }
    inStartElement = inEmptyElement = false;
    lastNamespaceDeclaration = namespaceDeclarations.size();
    didWriteAnyToken = true;
    return hadSomethingWritten;
}